

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSizePromotion.cpp
# Opt level: O0

void __thiscall
gl3cts::TextureSizePromotion::FunctionalTest::renderDataIntoMultisampledTexture
          (FunctionalTest *this,TextureInternalFormatDescriptor descriptor,GLenum target)

{
  TextureInternalFormatDescriptor descriptor_00;
  TextureInternalFormatDescriptor descriptor_01;
  TextureInternalFormatDescriptor descriptor_02;
  GLenum target_00;
  int iVar1;
  deUint32 err;
  GLuint GVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  GLenum local_24;
  long lStack_20;
  GLenum non_ms_target;
  Functions *gl;
  FunctionalTest *pFStack_10;
  GLenum target_local;
  FunctionalTest *this_local;
  
  gl._4_4_ = target;
  pFStack_10 = this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lStack_20 + 0x868))(0x8d57,&this->m_max_samples);
  err = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(err,"glGetIntegerv have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                  ,0x155);
  if (this->m_max_samples == 0) {
    this->m_max_samples = 1;
  }
  local_24 = 0x8c1a;
  if (gl._4_4_ == 0x9100) {
    local_24 = 0xde1;
  }
  cleanSourceTexture(this);
  memcpy(&local_68,&descriptor,0x40);
  descriptor_00.internal_format_name = (GLchar *)uStack_60;
  descriptor_00.required_by_context.super_ApiType.m_bits = (ApiType)(ApiType)(undefined4)local_68;
  descriptor_00.internal_format = local_68._4_4_;
  descriptor_00.is_sRGB = (bool)(undefined1)local_58;
  descriptor_00.is_color_renderable = (bool)local_58._1_1_;
  descriptor_00._18_2_ = local_58._2_2_;
  descriptor_00.min_red_size = local_58._4_4_;
  descriptor_00.min_green_size = (undefined4)uStack_50;
  descriptor_00.min_blue_size = uStack_50._4_4_;
  descriptor_00.min_alpha_size = (undefined4)local_48;
  descriptor_00.min_depth_size = local_48._4_4_;
  descriptor_00.min_stencil_size = (undefined4)uStack_40;
  descriptor_00.expected_red_type = uStack_40._4_4_;
  descriptor_00.expected_green_type = (undefined4)local_38;
  descriptor_00.expected_blue_type = local_38._4_4_;
  descriptor_00.expected_alpha_type = (undefined4)uStack_30;
  descriptor_00.expected_depth_type = uStack_30._4_4_;
  prepareSourceTexture(this,descriptor_00,local_24);
  memcpy(&local_a8,&descriptor,0x40);
  descriptor_01.internal_format_name = (GLchar *)uStack_a0;
  descriptor_01.required_by_context.super_ApiType.m_bits = (ApiType)(ApiType)(undefined4)local_a8;
  descriptor_01.internal_format = local_a8._4_4_;
  descriptor_01.is_sRGB = (bool)(undefined1)local_98;
  descriptor_01.is_color_renderable = (bool)local_98._1_1_;
  descriptor_01._18_2_ = local_98._2_2_;
  descriptor_01.min_red_size = local_98._4_4_;
  descriptor_01.min_green_size = (undefined4)uStack_90;
  descriptor_01.min_blue_size = uStack_90._4_4_;
  descriptor_01.min_alpha_size = (undefined4)local_88;
  descriptor_01.min_depth_size = local_88._4_4_;
  descriptor_01.min_stencil_size = (undefined4)uStack_80;
  descriptor_01.expected_red_type = uStack_80._4_4_;
  descriptor_01.expected_green_type = (undefined4)local_78;
  descriptor_01.expected_blue_type = local_78._4_4_;
  descriptor_01.expected_alpha_type = (undefined4)uStack_70;
  descriptor_01.expected_depth_type = uStack_70._4_4_;
  prepareDestinationTextureAndFramebuffer(this,descriptor_01,gl._4_4_);
  target_00 = local_24;
  memcpy(&local_e8,&descriptor,0x40);
  descriptor_02.internal_format_name = (GLchar *)uStack_e0;
  descriptor_02.required_by_context.super_ApiType.m_bits = (ApiType)(ApiType)(undefined4)local_e8;
  descriptor_02.internal_format = local_e8._4_4_;
  descriptor_02.is_sRGB = (bool)(undefined1)local_d8;
  descriptor_02.is_color_renderable = (bool)local_d8._1_1_;
  descriptor_02._18_2_ = local_d8._2_2_;
  descriptor_02.min_red_size = local_d8._4_4_;
  descriptor_02.min_green_size = (undefined4)uStack_d0;
  descriptor_02.min_blue_size = uStack_d0._4_4_;
  descriptor_02.min_alpha_size = (undefined4)local_c8;
  descriptor_02.min_depth_size = local_c8._4_4_;
  descriptor_02.min_stencil_size = (undefined4)uStack_c0;
  descriptor_02.expected_red_type = uStack_c0._4_4_;
  descriptor_02.expected_green_type = (undefined4)local_b8;
  descriptor_02.expected_blue_type = local_b8._4_4_;
  descriptor_02.expected_alpha_type = (undefined4)uStack_b0;
  descriptor_02.expected_depth_type = uStack_b0._4_4_;
  GVar2 = prepareProgram(this,target_00,descriptor_02,COMPONENTS_COUNT);
  this->m_program = GVar2;
  makeProgramAndSourceTextureActive(this,local_24);
  drawQuad(this);
  cleanFramebuffer(this);
  cleanSourceTexture(this);
  this->m_source_texture = this->m_destination_texture;
  this->m_destination_texture = 0;
  cleanProgram(this);
  return;
}

Assistant:

void FunctionalTest::renderDataIntoMultisampledTexture(TextureInternalFormatDescriptor descriptor, glw::GLenum target)
{
	/* GL functions object. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Fetch limits. */
	gl.getIntegerv(GL_MAX_SAMPLES, &m_max_samples);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv have failed");

	if (m_max_samples == 0)
	{
		m_max_samples = 1;
	}

	/* Setup target. */
	glw::GLenum non_ms_target = (target == GL_TEXTURE_2D_MULTISAMPLE) ? GL_TEXTURE_2D : GL_TEXTURE_2D_ARRAY;

	/* Cleanup required by prepareSourceTexture(...). */
	cleanSourceTexture();

	/* Prepare textures and program. */
	prepareSourceTexture(descriptor, non_ms_target);

	prepareDestinationTextureAndFramebuffer(descriptor, target);

	m_program = prepareProgram(non_ms_target, descriptor, COMPONENTS_COUNT);

	/* Setup GL and render texture. */
	makeProgramAndSourceTextureActive(non_ms_target);

	drawQuad();

	/* Cleanup. */
	cleanFramebuffer();
	cleanSourceTexture();

	/* Swpaing destination texture to source texture. */
	m_source_texture = m_destination_texture;

	m_destination_texture = 0;

	/* Clean program. */
	cleanProgram();
}